

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::UpdateTextureID(ImDrawList *this)

{
  int iVar1;
  uint uVar2;
  ImDrawCmd *pIVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ImVec4 *pIVar6;
  ImDrawCmd *pIVar7;
  long lVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  lVar8 = (long)(this->_TextureIdStack).Size;
  if (lVar8 == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = (this->_TextureIdStack).Data[lVar8 + -1];
  }
  iVar11 = (this->CmdBuffer).Size;
  lVar8 = (long)iVar11;
  pIVar3 = (this->CmdBuffer).Data;
  if ((pIVar3 + lVar8 + -1 == (ImDrawCmd *)0x0 || lVar8 == 0) ||
     (((uVar2 = pIVar3[lVar8 + -1].ElemCount, uVar2 != 0 && (pIVar3[lVar8 + -1].TextureId != pvVar9)
       ) || (pIVar3[lVar8 + -1].UserCallback != (ImDrawCallback)0x0)))) {
    lVar8 = (long)(this->_ClipRectStack).Size;
    pIVar6 = (this->_ClipRectStack).Data + lVar8 + -1;
    if (lVar8 == 0) {
      pIVar6 = &this->_Data->ClipRectFullscreen;
    }
    lVar8._0_4_ = pIVar6->x;
    lVar8._4_4_ = pIVar6->y;
    uVar4 = pIVar6->z;
    uVar5 = pIVar6->w;
    lVar12 = (long)(this->_TextureIdStack).Size;
    if (lVar12 == 0) {
      pvVar9 = (void *)0x0;
    }
    else {
      pvVar9 = (this->_TextureIdStack).Data[lVar12 + -1];
    }
    iVar11 = (this->CmdBuffer).Size;
    iVar1 = (this->CmdBuffer).Capacity;
    if (iVar11 == iVar1) {
      iVar11 = iVar11 + 1;
      if (iVar1 == 0) {
        iVar10 = 8;
      }
      else {
        iVar10 = iVar1 / 2 + iVar1;
      }
      if (iVar11 < iVar10) {
        iVar11 = iVar10;
      }
      if (iVar1 < iVar11) {
        pIVar7 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar11 * 0x30);
        pIVar3 = (this->CmdBuffer).Data;
        if (pIVar3 != (ImDrawCmd *)0x0) {
          memcpy(pIVar7,pIVar3,(long)(this->CmdBuffer).Size * 0x30);
          ImGui::MemFree((this->CmdBuffer).Data);
        }
        (this->CmdBuffer).Data = pIVar7;
        (this->CmdBuffer).Capacity = iVar11;
      }
    }
    pIVar7 = (this->CmdBuffer).Data;
    iVar11 = (this->CmdBuffer).Size;
    *(ulong *)&pIVar7[iVar11].ClipRect.w = CONCAT44(uStack_24,uVar5);
    pIVar3 = pIVar7 + iVar11;
    pIVar3->ElemCount = (int)(lVar8 << 0x20);
    (pIVar3->ClipRect).x = (float)(int)((ulong)(lVar8 << 0x20) >> 0x20);
    (pIVar3->ClipRect).y = (float)lVar8._4_4_;
    (pIVar3->ClipRect).z = (float)uVar4;
    pIVar7[iVar11].TextureId = pvVar9;
    pIVar7[iVar11].UserCallback = (ImDrawCallback)0x0;
    (&pIVar7[iVar11].UserCallback)[1] = (ImDrawCallback)0x0;
    (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
    return;
  }
  if (((1 < iVar11) && (uVar2 == 0)) && (pIVar3[lVar8 + -2].TextureId == pvVar9)) {
    lVar12 = (long)(this->_ClipRectStack).Size;
    pIVar6 = (this->_ClipRectStack).Data + lVar12 + -1;
    if (lVar12 == 0) {
      pIVar6 = &this->_Data->ClipRectFullscreen;
    }
    auVar13[0] = -(*(char *)&pIVar6->x == *(char *)&pIVar3[lVar8 + -2].ClipRect.x);
    auVar13[1] = -(*(char *)((long)&pIVar6->x + 1) ==
                  *(char *)((long)&pIVar3[lVar8 + -2].ClipRect.x + 1));
    auVar13[2] = -(*(char *)((long)&pIVar6->x + 2) ==
                  *(char *)((long)&pIVar3[lVar8 + -2].ClipRect.x + 2));
    auVar13[3] = -(*(char *)((long)&pIVar6->x + 3) ==
                  *(char *)((long)&pIVar3[lVar8 + -2].ClipRect.x + 3));
    auVar13[4] = -(*(char *)&pIVar6->y == *(char *)&pIVar3[lVar8 + -2].ClipRect.y);
    auVar13[5] = -(*(char *)((long)&pIVar6->y + 1) ==
                  *(char *)((long)&pIVar3[lVar8 + -2].ClipRect.y + 1));
    auVar13[6] = -(*(char *)((long)&pIVar6->y + 2) ==
                  *(char *)((long)&pIVar3[lVar8 + -2].ClipRect.y + 2));
    auVar13[7] = -(*(char *)((long)&pIVar6->y + 3) ==
                  *(char *)((long)&pIVar3[lVar8 + -2].ClipRect.y + 3));
    auVar13[8] = -(*(char *)&pIVar6->z == *(char *)&pIVar3[lVar8 + -2].ClipRect.z);
    auVar13[9] = -(*(char *)((long)&pIVar6->z + 1) ==
                  *(char *)((long)&pIVar3[lVar8 + -2].ClipRect.z + 1));
    auVar13[10] = -(*(char *)((long)&pIVar6->z + 2) ==
                   *(char *)((long)&pIVar3[lVar8 + -2].ClipRect.z + 2));
    auVar13[0xb] = -(*(char *)((long)&pIVar6->z + 3) ==
                    *(char *)((long)&pIVar3[lVar8 + -2].ClipRect.z + 3));
    auVar13[0xc] = -(*(char *)&pIVar6->w == *(char *)&pIVar3[lVar8 + -2].ClipRect.w);
    auVar13[0xd] = -(*(char *)((long)&pIVar6->w + 1) ==
                    *(char *)((long)&pIVar3[lVar8 + -2].ClipRect.w + 1));
    auVar13[0xe] = -(*(char *)((long)&pIVar6->w + 2) ==
                    *(char *)((long)&pIVar3[lVar8 + -2].ClipRect.w + 2));
    auVar13[0xf] = -(*(char *)((long)&pIVar6->w + 3) ==
                    *(char *)((long)&pIVar3[lVar8 + -2].ClipRect.w + 3));
    if (((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                 (ushort)(auVar13[0xf] >> 7) << 0xf) == 0xffff) &&
       (pIVar3[lVar8 + -2].UserCallback == (ImDrawCallback)0x0)) {
      (this->CmdBuffer).Size = iVar11 + -1;
      return;
    }
  }
  pIVar3[lVar8 + -1].TextureId = pvVar9;
  return;
}

Assistant:

void ImDrawList::UpdateTextureID()
{
    // If current command is used with different settings we need to add a new command
    const ImTextureID curr_texture_id = GetCurrentTextureId();
    ImDrawCmd* curr_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && curr_cmd->TextureId != curr_texture_id) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (curr_cmd->ElemCount == 0 && prev_cmd && prev_cmd->TextureId == curr_texture_id && memcmp(&prev_cmd->ClipRect, &GetCurrentClipRect(), sizeof(ImVec4)) == 0 && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->TextureId = curr_texture_id;
}